

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_namenode_client.cc
# Opt level: O2

Future<VoidResponse> * __thiscall
NarpcNamenodeClient::SetFile
          (Future<VoidResponse> *__return_storage_ptr__,NarpcNamenodeClient *this,
          FileInfo *file_info,bool close)

{
  int iVar1;
  shared_ptr<NarpcVoidResponse> response;
  shared_ptr<SetfileRequest> request;
  __shared_ptr<NarpcVoidResponse,_(__gnu_cxx::_Lock_policy)2> local_80;
  undefined1 local_70 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  RpcClient *local_30;
  
  std::make_shared<SetfileRequest,FileInfo&,bool&>((FileInfo *)local_70,(bool *)file_info);
  local_30 = &this->rpc_client_;
  std::make_shared<NarpcVoidResponse,RpcClient*>((RpcClient **)&local_80);
  std::__shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SetfileRequest,void>
            (local_40,(__shared_ptr<SetfileRequest,_(__gnu_cxx::_Lock_policy)2> *)local_70);
  std::__shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<NarpcVoidResponse,void>
            (local_50,&local_80);
  iVar1 = RpcClient::IssueRequest
                    (&this->rpc_client_,(shared_ptr<RpcMessage> *)local_40,
                     (shared_ptr<RpcMessage> *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  if (iVar1 < 0) {
    Future<VoidResponse>::Future(__return_storage_ptr__);
  }
  else {
    std::__shared_ptr<AsyncTask<VoidResponse>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<NarpcVoidResponse,void>
              ((__shared_ptr<AsyncTask<VoidResponse>,(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x10)
               ,&local_80);
    Future<VoidResponse>::Future
              (__return_storage_ptr__,(shared_ptr<AsyncTask<VoidResponse>_> *)(local_70 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  return __return_storage_ptr__;
}

Assistant:

Future<VoidResponse> NarpcNamenodeClient::SetFile(FileInfo &file_info,
                                                  bool close) {
  shared_ptr<SetfileRequest> request =
      make_shared<SetfileRequest>(file_info, close);
  shared_ptr<NarpcVoidResponse> response =
      make_shared<NarpcVoidResponse>(&rpc_client_);

  if (rpc_client_.IssueRequest(request, response) < 0) {
    return Future<VoidResponse>::Failure();
  }
  return Future<VoidResponse>(response);
}